

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O0

void __thiscall xs::posix::PipeReader::run(PipeReader *this)

{
  deFile *file;
  BlockBuffer<unsigned_char> *this_00;
  int __fd;
  bool bVar1;
  deFileResult dVar2;
  reference pvVar3;
  size_type bufSize;
  deInt64 *numReadPtr;
  CanceledException *anon_var_0;
  int iStack_48;
  deFileResult result;
  deInt64 numRead;
  allocator<unsigned_char> local_29;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  PipeReader *this_local;
  
  tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_29);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0x400,&local_29);
  std::allocator<unsigned_char>::~allocator(&local_29);
  _iStack_48 = 0;
  while (bVar1 = de::BlockBuffer<unsigned_char>::isCanceled(this->m_buf), ((bVar1 ^ 0xffU) & 1) != 0
        ) {
    file = this->m_file;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
    bufSize = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
    numReadPtr = (deInt64 *)&stack0xffffffffffffffb8;
    dVar2 = deFile_read(file,pvVar3,bufSize,numReadPtr);
    if (dVar2 == DE_FILERESULT_SUCCESS) {
      this_00 = this->m_buf;
      __fd = iStack_48;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
      de::BlockBuffer<unsigned_char>::write(this_00,__fd,pvVar3,(size_t)numReadPtr);
      de::BlockBuffer<unsigned_char>::flush(this->m_buf);
    }
    else {
      if ((dVar2 != DE_FILERESULT_END_OF_FILE) && (dVar2 != DE_FILERESULT_WOULD_BLOCK)) break;
      deSleep(100);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

void PipeReader::run (void)
{
	std::vector<deUint8>	tmpBuf		(FILEREADER_TMP_BUFFER_SIZE);
	deInt64					numRead		= 0;

	while (!m_buf->isCanceled())
	{
		deFileResult result = deFile_read(m_file, &tmpBuf[0], (deInt64)tmpBuf.size(), &numRead);

		if (result == DE_FILERESULT_SUCCESS)
		{
			// Write to buffer.
			try
			{
				m_buf->write((int)numRead, &tmpBuf[0]);
				m_buf->flush();
			}
			catch (const ThreadedByteBuffer::CanceledException&)
			{
				// Canceled.
				break;
			}
		}
		else if (result == DE_FILERESULT_END_OF_FILE ||
				 result == DE_FILERESULT_WOULD_BLOCK)
		{
			// Wait for more data.
			deSleep(FILEREADER_IDLE_SLEEP);
		}
		else
			break; // Error.
	}
}